

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O3

int GetAudioLength(char *filename)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  uchar for_int_number [4];
  undefined4 local_34;
  char local_30;
  byte abStack_2d [5];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_dafd::CheckHeader((FILE *)__stream);
    if (iVar1 != 0) {
      local_30 = '\0';
      local_34 = 0;
      fseek(__stream,10,1);
      fread(abStack_2d + 1,1,2,__stream);
      sVar3 = fread(&local_34,1,1,__stream);
      if (sVar3 != 0) {
        do {
          if ((char)local_34 == 'd') {
            fread((void *)((long)&local_34 + 1),1,3,__stream);
            if (local_30 == '\0' && local_34 == 0x61746164) break;
            fseek(__stream,-3,1);
          }
          sVar3 = fread(&local_34,1,1,__stream);
        } while (sVar3 != 0);
      }
      if (local_30 == '\0' && local_34 == 0x61746164) {
        lVar4 = 4;
        fread(abStack_2d + 1,1,4,__stream);
        fclose(__stream);
        uVar2 = 0;
        do {
          uVar2 = (uint)abStack_2d[lVar4] | uVar2 << 8;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        return (int)uVar2 / (int)(uint)(abStack_2d[1] >> 3);
      }
    }
    fclose(__stream);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int GetAudioLength(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    return 0;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return -1;
  }

  char data_check[5] = { 0 };
  data_check[4] = '\0';
  unsigned char for_int_number[4];

  // Quantization
  fseek(fp, 10, SEEK_CUR);
  fread(for_int_number, 1, 2, fp);
  int nbit = for_int_number[0];

  while (0 != fread(data_check, 1, 1, fp)) {
    if ('d' == data_check[0]) {
      fread(&data_check[1], 1, 3, fp);
      if (0 != strcmp(data_check, "data"))
        fseek(fp, -3, SEEK_CUR);
      else
        break;
    }
  }
  if (0 != strcmp(data_check, "data")) {
    fclose(fp);
    return -1;
  }

  fread(for_int_number, 1, 4, fp);  // "data"
  fclose(fp);

  int wav_length = 0;
  for (int i = 3; i >= 0; --i)
    wav_length = wav_length * 256 + for_int_number[i];
  wav_length /= (nbit / 8);

  return wav_length;
}